

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O0

void __thiscall bytearray_undo_rec::apply_undo(bytearray_undo_rec *this,CVmObjByteArray *arr)

{
  unsigned_long in_RSI;
  uchar *in_RDI;
  CVmObjByteArray *unaff_retaddr;
  size_t copy_len;
  unsigned_long rem;
  unsigned_long idx;
  bytearray_undo_bytes *cur;
  ulong local_30;
  ulong local_28;
  undefined8 *len;
  
  len = *(undefined8 **)(in_RDI + 0x10);
  for (local_28 = *(ulong *)(in_RDI + 8); local_28 != 0; local_28 = local_28 - local_30) {
    local_30 = 0x8000;
    if (local_28 < 0x8000) {
      local_30 = local_28;
    }
    CVmObjByteArray::copy_from_buf(unaff_retaddr,in_RDI,in_RSI,(size_t)len);
    len = (undefined8 *)*len;
  }
  return;
}

Assistant:

void apply_undo(CVmObjByteArray *arr)
    {
        bytearray_undo_bytes *cur;
        unsigned long idx;
        unsigned long rem;

        /* delete our list of saved byte blocks */
        for (cur = save_head_, idx = idx_, rem = cnt_ ; rem != 0 ; )
        {
            size_t copy_len;
            
            /* limit the copy to our block size (32k) */
            copy_len = 32768;
            if (copy_len > rem)
                copy_len = (size_t)rem;

            /* copy this block into the array */
            arr->copy_from_buf(cur->buf_, idx, copy_len);

            /* move past the copied data */
            cur = cur->nxt_;
            idx += copy_len;
            rem -= copy_len;
        }
    }